

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void parallel_for_1d(thread_pool *thread_pool,_func_void_parallel_task_1d_ptr_size_t *compute,
                    parallel_task_1d *init,size_t task_size,range *range)

{
  size_t count;
  ulong uVar1;
  work_item *last;
  work_item *first;
  work_item *pwVar2;
  work_item *last_00;
  work_item *pwVar3;
  ulong uVar4;
  work_item *pwVar5;
  work_item *local_48;
  
  count = thread_pool->thread_count;
  uVar1 = count * 2;
  if (uVar1 * task_size != 0) {
    local_48 = (work_item *)malloc(uVar1 * task_size);
    if (local_48 != (work_item *)0x0) goto LAB_00101a52;
    parallel_for_1d_cold_1();
  }
  local_48 = (work_item *)0x0;
LAB_00101a52:
  (init->work_item).work_fn = (work_fn_t)compute;
  (init->work_item).next = (work_item *)0x0;
  pwVar5 = local_48;
  for (uVar4 = uVar1; uVar4 != 0; uVar4 = uVar4 - 1) {
    memcpy(pwVar5,init,task_size);
    if (uVar4 != 1) {
      pwVar5->next = (work_item *)((long)&pwVar5->work_fn + task_size);
    }
    pwVar5 = (work_item *)((long)&pwVar5->work_fn + task_size);
  }
  pwVar5 = (work_item *)range->begin;
  pwVar2 = (work_item *)range->end;
  uVar4 = (long)pwVar2 - (long)pwVar5;
  last = (work_item *)0x0;
  last_00 = local_48;
  first = local_48;
  if (pwVar5 < pwVar2) {
    do {
      if (last_00 == (work_item *)0x0) {
        __assert_fail("current_task",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0x108,
                      "void parallel_for_1d(struct thread_pool *, void (*)(struct parallel_task_1d *, size_t), struct parallel_task_1d *, size_t, const struct range *)"
                     );
      }
      last_00[1].work_fn = (work_fn_t)pwVar5;
      pwVar5 = (work_item *)((long)pwVar5 + ((uVar4 / uVar1 + 1) - (ulong)(uVar4 % uVar1 == 0)));
      if (pwVar5 < pwVar2) {
        pwVar2 = pwVar5;
      }
      last_00[1].next = pwVar2;
      last = last_00;
      pwVar3 = last_00->next;
      if (last_00->next == (work_item *)0x0) {
        submit_work(thread_pool,first,last_00);
        first = wait_for_completion(thread_pool,count);
        last = (work_item *)0x0;
        pwVar3 = first;
      }
      pwVar2 = (work_item *)range->end;
      last_00 = pwVar3;
    } while (pwVar5 < pwVar2);
  }
  if (last != (work_item *)0x0) {
    last->next = (work_item *)0x0;
    submit_work(thread_pool,first,last);
  }
  wait_for_completion(thread_pool,0);
  free(local_48);
  return;
}

Assistant:

void parallel_for_1d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_1d*, size_t),
    struct parallel_task_1d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size = compute_chunk_size(range[0].end - range[0].begin, task_count);
    for (size_t i = range[0].begin; i < range[0].end; i += chunk_size) {
        assert(current_task);
        ((struct parallel_task_1d*)current_task)->range.begin = i;
        ((struct parallel_task_1d*)current_task)->range.end   = range_end(i, chunk_size, range[0].end);
        previous_task = current_task;
        current_task = current_task->next;
        if (!current_task) {
            submit_work(thread_pool, first_task, previous_task);
            first_task = current_task = wait_for_completion(thread_pool, thread_count);
            previous_task = NULL;
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}